

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O2

ssize_t __thiscall
icu_63::StringTrieBuilder::SplitBranchNode::write
          (SplitBranchNode *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  StringTrieBuilder *builder;
  
  builder = (StringTrieBuilder *)CONCAT44(in_register_00000034,__fd);
  Node::writeUnlessInsideRightEdge
            (this->lessThan,(this->super_BranchNode).firstEdgeNumber,this->greaterOrEqual->offset,
             builder);
  (*(this->greaterOrEqual->super_UObject)._vptr_UObject[5])(this->greaterOrEqual,builder);
  (*(builder->super_UObject)._vptr_UObject[0x13])(builder,(ulong)(uint)this->lessThan->offset);
  iVar1 = (*(builder->super_UObject)._vptr_UObject[0xf])
                    (builder,(ulong)*(ushort *)&(this->super_BranchNode).field_0x14);
  (this->super_BranchNode).super_Node.offset = iVar1;
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

void
StringTrieBuilder::SplitBranchNode::write(StringTrieBuilder &builder) {
    // Encode the less-than branch first.
    lessThan->writeUnlessInsideRightEdge(firstEdgeNumber, greaterOrEqual->getOffset(), builder);
    // Encode the greater-or-equal branch last because we do not jump for it at all.
    greaterOrEqual->write(builder);
    // Write this node.
    U_ASSERT(lessThan->getOffset()>0);
    builder.writeDeltaTo(lessThan->getOffset());  // less-than
    offset=builder.write(unit);
}